

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

void __thiscall stackjit::Loader::Class::Class(Class *this,string *name)

{
  string *name_local;
  Class *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>::vector
            (&this->mFields);
  std::__cxx11::string::string((string *)&this->mParentClassName);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
  ::unordered_map(&this->mAttributes);
  return;
}

Assistant:

Loader::Class::Class(std::string name)
		: mName(name) {

	}